

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

bool __thiscall leveldb::DBImpl::GetProperty(DBImpl *this,Slice *property,string *value)

{
  long *__s1;
  ulong __n;
  size_type __len1;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t __len2;
  undefined4 extraout_var;
  size_t sVar4;
  int64_t iVar5;
  bool bVar6;
  CompactionStats *pCVar7;
  int level;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint64_t level_1;
  Slice in;
  char buf [50];
  ulong local_120;
  Slice local_118;
  string local_108 [6];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = '\0';
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_system_error(iVar2);
LAB_0066fa5b:
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                    ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
    }
    goto LAB_0066fac9;
  }
  local_118.data_ = property->data_;
  uVar9 = property->size_;
  local_118.size_ = uVar9;
  if ((uVar9 < 8) || (*(long *)local_118.data_ != 0x2e62646c6576656c)) {
    bVar6 = false;
  }
  else {
    if (uVar9 < 8) goto LAB_0066fa5b;
    __s1 = (long *)((long)local_118.data_ + 8);
    __n = uVar9 - 8;
    if ((__n < 0x12) ||
       (auVar10[0] = -((char)*__s1 == 'n'),
       auVar10[1] = -(*(char *)((long)local_118.data_ + 9) == 'u'),
       auVar10[2] = -(*(char *)((long)local_118.data_ + 10) == 'm'),
       auVar10[3] = -(*(char *)((long)local_118.data_ + 0xb) == '-'),
       auVar10[4] = -(*(char *)((long)local_118.data_ + 0xc) == 'f'),
       auVar10[5] = -(*(char *)((long)local_118.data_ + 0xd) == 'i'),
       auVar10[6] = -(*(char *)((long)local_118.data_ + 0xe) == 'l'),
       auVar10[7] = -(*(char *)((long)local_118.data_ + 0xf) == 'e'),
       auVar10[8] = -((char)*(long *)((long)local_118.data_ + 0x10) == 's'),
       auVar10[9] = -(*(char *)((long)local_118.data_ + 0x11) == '-'),
       auVar10[10] = -(*(char *)((long)local_118.data_ + 0x12) == 'a'),
       auVar10[0xb] = -(*(char *)((long)local_118.data_ + 0x13) == 't'),
       auVar10[0xc] = -(*(char *)((long)local_118.data_ + 0x14) == '-'),
       auVar10[0xd] = -(*(char *)((long)local_118.data_ + 0x15) == 'l'),
       auVar10[0xe] = -(*(char *)((long)local_118.data_ + 0x16) == 'e'),
       auVar10[0xf] = -(*(char *)((long)local_118.data_ + 0x17) == 'v'),
       auVar11[0] = -((char)(short)*(long *)((long)local_118.data_ + 0x18) == 'e'),
       auVar11[1] = -((char)((ushort)(short)*(long *)((long)local_118.data_ + 0x18) >> 8) == 'l'),
       auVar11[2] = 0xff, auVar11[3] = 0xff, auVar11[4] = 0xff, auVar11[5] = 0xff, auVar11[6] = 0xff
       , auVar11[7] = 0xff, auVar11[8] = 0xff, auVar11[9] = 0xff, auVar11[10] = 0xff,
       auVar11[0xb] = 0xff, auVar11[0xc] = 0xff, auVar11[0xd] = 0xff, auVar11[0xe] = 0xff,
       auVar11[0xf] = 0xff, auVar11 = auVar11 & auVar10,
       (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff)) {
      local_118.data_ = (char *)__s1;
      local_118.size_ = __n;
      if (uVar9 == 0x20) {
LAB_0066f7f5:
        iVar2 = bcmp(__s1,"approximate-memory-usage",__n);
        if (iVar2 == 0) {
          iVar2 = (*((this->options_).block_cache)->_vptr_Cache[9])();
          lVar8 = CONCAT44(extraout_var,iVar2);
          if (this->mem_ != (MemTable *)0x0) {
            sVar4 = MemTable::ApproximateMemoryUsage(this->mem_);
            lVar8 = lVar8 + sVar4;
          }
          if (this->imm_ != (MemTable *)0x0) {
            sVar4 = MemTable::ApproximateMemoryUsage(this->imm_);
            lVar8 = lVar8 + sVar4;
          }
          snprintf((char *)local_108,0x32,"%llu",lVar8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (value,(char *)local_108);
LAB_0066f90c:
          bVar6 = true;
          goto LAB_0066f70f;
        }
      }
      else if (uVar9 == 0x10) {
        iVar2 = bcmp(__s1,"sstables",__n);
        if (iVar2 == 0) {
          Version::DebugString_abi_cxx11_(local_108,this->versions_->current_);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (value,local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108[0]._M_dataplus._M_p != &local_108[0].field_2) {
            operator_delete(local_108[0]._M_dataplus._M_p,
                            local_108[0].field_2._M_allocated_capacity + 1);
          }
          goto LAB_0066f90c;
        }
        if (__n == 0x18) goto LAB_0066f7f5;
      }
      else if ((uVar9 == 0xd) && (iVar2 = bcmp(__s1,"stats",__n), iVar2 == 0)) {
        memcpy(local_108,
               "                               Compactions\nLevel  Files Size(MB) Time(sec) Read(MB) Write(MB)\n--------------------------------------------------\n"
               ,0x92);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (value,(char *)local_108);
        pCVar7 = this->stats_;
        uVar9 = 0;
        do {
          uVar3 = VersionSet::NumLevelFiles(this->versions_,(int)uVar9);
          if ((0 < (int)uVar3) || (0 < pCVar7->micros)) {
            iVar5 = VersionSet::NumLevelBytes(this->versions_,(int)uVar9);
            snprintf((char *)local_108,200,"%3d %8d %8.0f %9.0f %8.0f %9.0f\n",
                     (double)iVar5 * 9.5367431640625e-07,(double)pCVar7->micros / 1000000.0,
                     (double)pCVar7->bytes_read * 9.5367431640625e-07,
                     (double)pCVar7->bytes_written * 9.5367431640625e-07,uVar9 & 0xffffffff,
                     (ulong)uVar3);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (value,(char *)local_108);
          }
          uVar9 = uVar9 + 1;
          pCVar7 = pCVar7 + 1;
        } while (uVar9 != 7);
        bVar6 = true;
        goto LAB_0066f70f;
      }
      bVar6 = false;
    }
    else {
      local_118.data_ = (char *)((long)local_118.data_ + 0x1a);
      local_118.size_ = uVar9 - 0x1a;
      bVar1 = ConsumeDecimalNumber(&local_118,&local_120);
      bVar6 = local_120 < 7 && (bVar1 && local_118.size_ == 0);
      if (local_120 < 7 && (bVar1 && local_118.size_ == 0)) {
        uVar3 = VersionSet::NumLevelFiles(this->versions_,(int)local_120);
        snprintf((char *)local_108,100,"%d",(ulong)uVar3);
        __len1 = value->_M_string_length;
        __len2 = strlen((char *)local_108);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (value,0,__len1,(char *)local_108,__len2);
      }
    }
  }
LAB_0066f70f:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
LAB_0066fac9:
  __stack_chk_fail();
}

Assistant:

bool DBImpl::GetProperty(const Slice& property, std::string* value) {
  value->clear();

  MutexLock l(&mutex_);
  Slice in = property;
  Slice prefix("leveldb.");
  if (!in.starts_with(prefix)) return false;
  in.remove_prefix(prefix.size());

  if (in.starts_with("num-files-at-level")) {
    in.remove_prefix(strlen("num-files-at-level"));
    uint64_t level;
    bool ok = ConsumeDecimalNumber(&in, &level) && in.empty();
    if (!ok || level >= config::kNumLevels) {
      return false;
    } else {
      char buf[100];
      snprintf(buf, sizeof(buf), "%d",
               versions_->NumLevelFiles(static_cast<int>(level)));
      *value = buf;
      return true;
    }
  } else if (in == "stats") {
    char buf[200];
    snprintf(buf, sizeof(buf),
             "                               Compactions\n"
             "Level  Files Size(MB) Time(sec) Read(MB) Write(MB)\n"
             "--------------------------------------------------\n");
    value->append(buf);
    for (int level = 0; level < config::kNumLevels; level++) {
      int files = versions_->NumLevelFiles(level);
      if (stats_[level].micros > 0 || files > 0) {
        snprintf(buf, sizeof(buf), "%3d %8d %8.0f %9.0f %8.0f %9.0f\n", level,
                 files, versions_->NumLevelBytes(level) / 1048576.0,
                 stats_[level].micros / 1e6,
                 stats_[level].bytes_read / 1048576.0,
                 stats_[level].bytes_written / 1048576.0);
        value->append(buf);
      }
    }
    return true;
  } else if (in == "sstables") {
    *value = versions_->current()->DebugString();
    return true;
  } else if (in == "approximate-memory-usage") {
    size_t total_usage = options_.block_cache->TotalCharge();
    if (mem_) {
      total_usage += mem_->ApproximateMemoryUsage();
    }
    if (imm_) {
      total_usage += imm_->ApproximateMemoryUsage();
    }
    char buf[50];
    snprintf(buf, sizeof(buf), "%llu",
             static_cast<unsigned long long>(total_usage));
    value->append(buf);
    return true;
  }

  return false;
}